

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CpuBackend.cpp
# Opt level: O0

void __thiscall xmrig::CpuBackend::printHashrate(CpuBackend *this,bool details)

{
  int64_t iVar1;
  bool bVar2;
  long lVar3;
  reference pCVar4;
  char *pcVar5;
  char *h;
  char *pcVar6;
  byte in_SIL;
  long *in_RDI;
  CpuLaunchData *data;
  iterator __end1;
  iterator __begin1;
  vector<xmrig::CpuLaunchData,_std::allocator<xmrig::CpuLaunchData>_> *__range1;
  size_t i;
  char num [24];
  vector<xmrig::CpuLaunchData,_std::allocator<xmrig::CpuLaunchData>_> *in_stack_ffffffffffffff78;
  __normal_iterator<xmrig::CpuLaunchData_*,_std::vector<xmrig::CpuLaunchData,_std::allocator<xmrig::CpuLaunchData>_>_>
  *in_stack_ffffffffffffff80;
  char *in_stack_ffffffffffffff98;
  Hashrate *in_stack_ffffffffffffffa0;
  __normal_iterator<xmrig::CpuLaunchData_*,_std::vector<xmrig::CpuLaunchData,_std::allocator<xmrig::CpuLaunchData>_>_>
  local_40;
  long local_38;
  long local_30;
  size_t in_stack_ffffffffffffffd8;
  size_t in_stack_ffffffffffffffe0;
  Hashrate *in_stack_ffffffffffffffe8;
  
  if (((in_SIL & 1) != 0) && (lVar3 = (**(code **)(*in_RDI + 0x20))(), lVar3 != 0)) {
    memset(&stack0xffffffffffffffd8,0,0x18);
    Log::print("\x1b[1;37m|    CPU # | AFFINITY | 10s H/s | 60s H/s | 15m H/s |");
    local_30 = 0;
    local_38 = in_RDI[1] + 0x48;
    local_40._M_current =
         (CpuLaunchData *)
         std::vector<xmrig::CpuLaunchData,_std::allocator<xmrig::CpuLaunchData>_>::begin
                   (in_stack_ffffffffffffff78);
    std::vector<xmrig::CpuLaunchData,_std::allocator<xmrig::CpuLaunchData>_>::end
              (in_stack_ffffffffffffff78);
    while (bVar2 = __gnu_cxx::operator!=
                             (in_stack_ffffffffffffff80,
                              (__normal_iterator<xmrig::CpuLaunchData_*,_std::vector<xmrig::CpuLaunchData,_std::allocator<xmrig::CpuLaunchData>_>_>
                               *)in_stack_ffffffffffffff78), bVar2) {
      pCVar4 = __gnu_cxx::
               __normal_iterator<xmrig::CpuLaunchData_*,_std::vector<xmrig::CpuLaunchData,_std::allocator<xmrig::CpuLaunchData>_>_>
               ::operator*(&local_40);
      lVar3 = local_30;
      iVar1 = pCVar4->affinity;
      (**(code **)(*in_RDI + 0x20))();
      Hashrate::calc(in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
      in_stack_ffffffffffffff98 =
           Hashrate::format((double)in_stack_ffffffffffffff80,(char *)in_stack_ffffffffffffff78,
                            0x1fe855);
      (**(code **)(*in_RDI + 0x20))();
      Hashrate::calc(in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
      in_stack_ffffffffffffffa0 =
           (Hashrate *)
           Hashrate::format((double)in_stack_ffffffffffffff80,(char *)in_stack_ffffffffffffff78,
                            0x1fe88a);
      (**(code **)(*in_RDI + 0x20))();
      Hashrate::calc(in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
      pcVar5 = Hashrate::format((double)in_stack_ffffffffffffff80,(char *)in_stack_ffffffffffffff78,
                                0x1fe8bf);
      Log::print("| %8zu | %8ld | %7s | %7s | %7s |",lVar3,iVar1,in_stack_ffffffffffffff98,
                 in_stack_ffffffffffffffa0,pcVar5);
      local_30 = local_30 + 1;
      __gnu_cxx::
      __normal_iterator<xmrig::CpuLaunchData_*,_std::vector<xmrig::CpuLaunchData,_std::allocator<xmrig::CpuLaunchData>_>_>
      ::operator++(&local_40);
    }
    (**(code **)(*in_RDI + 0x20))();
    Hashrate::calc(in_stack_ffffffffffffffa0,(size_t)in_stack_ffffffffffffff98);
    pcVar5 = Hashrate::format((double)in_stack_ffffffffffffff80,(char *)in_stack_ffffffffffffff78,
                              0x1fe928);
    (**(code **)(*in_RDI + 0x20))();
    Hashrate::calc(in_stack_ffffffffffffffa0,(size_t)in_stack_ffffffffffffff98);
    h = Hashrate::format((double)in_stack_ffffffffffffff80,pcVar5,0x1fe957);
    (**(code **)(*in_RDI + 0x20))();
    Hashrate::calc(in_stack_ffffffffffffffa0,(size_t)in_stack_ffffffffffffff98);
    pcVar6 = Hashrate::format((double)h,pcVar5,0x1fe987);
    Log::print("\x1b[1;37m|        - |        - | %7s | %7s | %7s |",pcVar5,h,pcVar6);
  }
  return;
}

Assistant:

void xmrig::CpuBackend::printHashrate(bool details)
{
    if (!details || !hashrate()) {
        return;
    }

    char num[8 * 3] = { 0 };

    Log::print(WHITE_BOLD_S "|    CPU # | AFFINITY | 10s H/s | 60s H/s | 15m H/s |");

    size_t i = 0;
    for (const CpuLaunchData &data : d_ptr->threads) {
         Log::print("| %8zu | %8" PRId64 " | %7s | %7s | %7s |",
                    i,
                    data.affinity,
                    Hashrate::format(hashrate()->calc(i, Hashrate::ShortInterval),  num,         sizeof num / 3),
                    Hashrate::format(hashrate()->calc(i, Hashrate::MediumInterval), num + 8,     sizeof num / 3),
                    Hashrate::format(hashrate()->calc(i, Hashrate::LargeInterval),  num + 8 * 2, sizeof num / 3)
                    );

         i++;
    }

#   ifdef XMRIG_FEATURE_OPENCL
    Log::print(WHITE_BOLD_S "|        - |        - | %7s | %7s | %7s |",
               Hashrate::format(hashrate()->calc(Hashrate::ShortInterval),  num,         sizeof num / 3),
               Hashrate::format(hashrate()->calc(Hashrate::MediumInterval), num + 8,     sizeof num / 3),
               Hashrate::format(hashrate()->calc(Hashrate::LargeInterval),  num + 8 * 2, sizeof num / 3)
               );
#   endif
}